

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

size_t ctemplate::Template::InsertLine
                 (char *line,size_t len,Strip strip,MarkerDelimiters *delim,char *buffer)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  size_t local_30;
  char *local_28;
  
  if (len == 0) {
    bVar3 = false;
  }
  else {
    bVar3 = line[len - 1] == '\n';
  }
  local_30 = len;
  if (bVar3) {
    local_30 = len - 1;
  }
  local_28 = line;
  if ((int)strip < 2) {
    if (strip == STRIP_BLANK_LINES) {
      bVar2 = IsBlankOrOnlyHasOneRemovableMarker(&local_28,&local_30,delim);
      bVar3 = (bool)(bVar3 & !bVar2);
    }
    sVar1 = local_30;
    memcpy(buffer,local_28,local_30);
    if (bVar3) {
      local_30 = sVar1 + 1;
      buffer[sVar1] = '\n';
    }
  }
  else {
    StripTemplateWhiteSpace(&local_28,&local_30);
    memcpy(buffer,local_28,local_30);
  }
  return local_30;
}

Assistant:

size_t Template::InsertLine(const char *line, size_t len, Strip strip,
                            const MarkerDelimiters& delim, char* buffer) {
  bool add_newline = (len > 0 && line[len-1] == '\n');
  if (add_newline)
    len--;                 // so we ignore the newline from now on

  if (strip >= STRIP_WHITESPACE) {
    StripTemplateWhiteSpace(&line, &len);
    add_newline = false;

    // IsBlankOrOnlyHasOneRemovableMarker may modify the two input
    // parameters if the line contains only spaces or only one input
    // marker.  This modification must be done before the line is
    // written to the input buffer. Hence the need for the boolean flag
    // add_newline to be referenced after the Write statement.
  } else if (strip >= STRIP_BLANK_LINES
             && IsBlankOrOnlyHasOneRemovableMarker(&line, &len, delim)) {
    add_newline = false;
  }

  memcpy(buffer, line, len);

  if (add_newline) {
    buffer[len++] = '\n';
  }
  return len;
}